

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

void __thiscall Expr::GenCaseEval(Expr *this,Output *out_cc,Env *env)

{
  pointer pcVar1;
  Type *pTVar2;
  ID *id;
  char *pcVar3;
  char *pcVar4;
  CaseExprList *pCVar5;
  Exception *pEVar6;
  pointer ppCVar7;
  CaseExpr *pCVar8;
  CaseExpr *pCVar9;
  undefined8 local_90 [4];
  string local_70;
  string local_50;
  
  pTVar2 = DataType(this,env);
  id = Env::AddTempID(env,pTVar2);
  if (pTVar2 == (Type *)0x0) {
    pEVar6 = (Exception *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"undefined case value",(allocator<char> *)local_90);
    Exception::Exception(pEVar6,&this->super_Object,&local_50);
    __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
  }
  (*(pTVar2->super_DataDepElement)._vptr_DataDepElement[0xb])(local_90,pTVar2);
  pcVar3 = Env::LValue(env,id);
  Output::println(out_cc,"%s %s;",local_90[0],pcVar3);
  std::__cxx11::string::~string((string *)local_90);
  ForceIDEval(this->operand_[0],out_cc,env);
  pCVar5 = this->cases_;
  if (pCVar5 != (CaseExprList *)0x0) {
    for (ppCVar7 = (pCVar5->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar7 !=
        (pCVar5->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppCVar7 = ppCVar7 + 1) {
      ForceIDEval((*ppCVar7)->value_,out_cc,env);
      pCVar5 = this->cases_;
    }
  }
  pcVar3 = EvalExpr(this->operand_[0],out_cc,env);
  pCVar8 = (CaseExpr *)0x0;
  Output::println(out_cc,"switch ( %s )",pcVar3);
  pTVar2 = DataType(this->operand_[0],env);
  out_cc->indent_ = out_cc->indent_ + 1;
  Output::println(out_cc,"{");
  pCVar5 = this->cases_;
  if (pCVar5 != (CaseExprList *)0x0) {
    pCVar8 = (CaseExpr *)0x0;
    for (ppCVar7 = (pCVar5->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar7 !=
        (pCVar5->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppCVar7 = ppCVar7 + 1) {
      pCVar9 = *ppCVar7;
      if (pCVar9->index_ == (ExprList *)0x0) {
        if (pCVar8 != (CaseExpr *)0x0) {
          pEVar6 = (Exception *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"duplicate default cases",(allocator<char> *)local_90);
          Exception::Exception(pEVar6,&pCVar9->super_Object,&local_70);
          __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
        }
      }
      else {
        GenCaseStr(pCVar9->index_,out_cc,env,pTVar2);
        out_cc->indent_ = out_cc->indent_ + 1;
        pcVar3 = Env::LValue(env,id);
        pcVar4 = EvalExpr(pCVar9->value_,out_cc,env);
        Output::println(out_cc,"%s = %s;",pcVar3,pcVar4);
        Output::println(out_cc,"break;");
        out_cc->indent_ = out_cc->indent_ + -1;
        pCVar5 = this->cases_;
        pCVar9 = pCVar8;
      }
      pCVar8 = pCVar9;
    }
  }
  GenCaseStr((ExprList *)0x0,out_cc,env,pTVar2);
  out_cc->indent_ = out_cc->indent_ + 1;
  if (pCVar8 == (CaseExpr *)0x0) {
    pcVar1 = (this->super_Object).location._M_dataplus._M_p;
    pcVar3 = EvalExpr(this->operand_[0],out_cc,env);
    Output::println(out_cc,"throw binpac::ExceptionInvalidCaseIndex(\"%s\", (int64)%s);",pcVar1,
                    pcVar3);
  }
  else {
    pcVar3 = Env::LValue(env,id);
    pcVar4 = EvalExpr(pCVar8->value_,out_cc,env);
    Output::println(out_cc,"%s = %s;",pcVar3,pcVar4);
  }
  Output::println(out_cc,"break;");
  out_cc->indent_ = out_cc->indent_ + -1;
  Output::println(out_cc,"}");
  out_cc->indent_ = out_cc->indent_ + -1;
  Env::SetEvaluated(env,id,true);
  Env::RValue(env,id);
  std::__cxx11::string::assign((char *)&this->str_);
  return;
}

Assistant:

void Expr::GenCaseEval(Output* out_cc, Env* env)
	{
	ASSERT(expr_type_ == EXPR_CASE);
	ASSERT(operand_[0]);
	ASSERT(cases_);

	Type* val_type = DataType(env);
	ID* val_var = env->AddTempID(val_type);

	// DataType(env) can return a null pointer if an enum value is not
	// defined.
	if ( ! val_type )
		throw Exception(this, "undefined case value");

	out_cc->println("%s %s;", val_type->DataTypeStr().c_str(), env->LValue(val_var));

	// force evaluation of IDs appearing in case stmt
	operand_[0]->ForceIDEval(out_cc, env);
	foreach (i, CaseExprList, cases_)
		(*i)->value()->ForceIDEval(out_cc, env);

	out_cc->println("switch ( %s )", operand_[0]->EvalExpr(out_cc, env));
	Type* switch_type = operand_[0]->DataType(env);

	out_cc->inc_indent();
	out_cc->println("{");

	CaseExpr* default_case = nullptr;
	foreach (i, CaseExprList, cases_)
		{
		CaseExpr* c = *i;
		ExprList* index = c->index();
		if ( ! index )
			{
			if ( default_case )
				throw Exception(c, "duplicate default cases");
			default_case = c;
			}
		else
			{
			GenCaseStr(index, out_cc, env, switch_type);
			out_cc->inc_indent();
			out_cc->println("%s = %s;", env->LValue(val_var), c->value()->EvalExpr(out_cc, env));
			out_cc->println("break;");
			out_cc->dec_indent();
			}
		}

	// Generate the default case after all other cases
	GenCaseStr(nullptr, out_cc, env, switch_type);
	out_cc->inc_indent();
	if ( default_case )
		{
		out_cc->println("%s = %s;", env->LValue(val_var),
		                default_case->value()->EvalExpr(out_cc, env));
		}
	else
		{
		out_cc->println("throw binpac::ExceptionInvalidCaseIndex(\"%s\", (int64)%s);", Location(),
		                operand_[0]->EvalExpr(out_cc, env));
		}
	out_cc->println("break;");
	out_cc->dec_indent();

	out_cc->println("}");
	out_cc->dec_indent();

	env->SetEvaluated(val_var);
	str_ = env->RValue(val_var);
	}